

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::preprocessInclude(TraverseSchema *this,DOMElement *elem)

{
  NamespaceScope *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  DOMElement *pDVar4;
  XSAnnotation *annotation;
  XMLCh *loc;
  InputSource *source;
  undefined4 extraout_var;
  SchemaInfo *pSVar5;
  XSDDOMParser *pXVar6;
  DOMDocument *pDVar7;
  undefined4 extraout_var_00;
  XMLCh *str1;
  undefined4 extraout_var_02;
  SchemaInfo *pSVar8;
  NamespaceScopeManager nsMgr;
  XMLCh *schemaURL;
  undefined4 extraout_var_01;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x19,this,true,this->fNonXSAttList);
  pDVar4 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar4 = checkContent(this,elem,pDVar4,true,true);
  if (pDVar4 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x4d);
  }
  if (this->fAnnotation == (XSAnnotation *)0x0) {
    if ((this->fScanner->fGenerateSyntheticAnnotations == true) &&
       (this->fNonXSAttList->fCurCount != 0)) {
      annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = annotation;
      SchemaGrammar::addAnnotation(this->fSchemaGrammar,annotation);
    }
  }
  else {
    SchemaGrammar::addAnnotation(this->fSchemaGrammar,this->fAnnotation);
  }
  loc = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SCHEMALOCATION,AnyURI);
  if ((loc == (XMLCh *)0x0) || (*loc == L'\0')) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x4b,
                      (XMLCh *)SchemaSymbols::fgELT_INCLUDE,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_003103ee;
  }
  XSDLocator::setValues
            (this->fLocator,this->fSchemaInfo->fCurrentSchemaURL,(XMLCh *)0x0,
             (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
             (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
  source = resolveSchemaLocation(this,loc,SchemaInclude,(XMLCh *)0x0);
  if (source == (InputSource *)0x0) goto LAB_003103ee;
  iVar2 = (*source->_vptr_InputSource[5])(source);
  schemaURL = (XMLCh *)CONCAT44(extraout_var,iVar2);
  pSVar5 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                     (this->fCachedSchemaInfoList,schemaURL,this->fTargetNSURI);
  if (pSVar5 == (SchemaInfo *)0x0) {
    if (this->fSchemaInfoList != this->fCachedSchemaInfoList) {
      pSVar5 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                         (this->fSchemaInfoList,schemaURL,this->fTargetNSURI);
      if (pSVar5 != (SchemaInfo *)0x0) goto LAB_003103ab;
    }
    pXVar6 = this->fParser;
    if (pXVar6 == (XSDDOMParser *)0x0) {
      pXVar6 = (XSDDOMParser *)XMemory::operator_new(0x178,this->fGrammarPoolMemoryManager);
      XSDDOMParser::XSDDOMParser
                (pXVar6,(XMLValidator *)0x0,this->fGrammarPoolMemoryManager,(XMLGrammarPool *)0x0);
      this->fParser = pXVar6;
    }
    AbstractDOMParser::setValidationScheme((AbstractDOMParser *)pXVar6,Val_Never);
    AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this->fParser,true);
    XSDDOMParser::setUserEntityHandler(this->fParser,this->fEntityHandler);
    XSDDOMParser::setUserErrorReporter(this->fParser,this->fErrorReporter);
    uVar3 = (*source->_vptr_InputSource[6])(source);
    (*source->_vptr_InputSource[10])(source,0);
    AbstractDOMParser::parse((AbstractDOMParser *)this->fParser,source);
    (*source->_vptr_InputSource[10])(source,(ulong)(uVar3 & 0xff));
    pXVar6 = this->fParser;
    if ((pXVar6->fSawFatal == true) && (this->fScanner->fExitOnFirstFatal == true)) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x105);
      pXVar6 = this->fParser;
    }
    pDVar7 = AbstractDOMParser::getDocument((AbstractDOMParser *)pXVar6);
    if (pDVar7 != (DOMDocument *)0x0) {
      iVar2 = (*(pDVar7->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar7);
      pDVar4 = (DOMElement *)CONCAT44(extraout_var_00,iVar2);
      if (pDVar4 != (DOMElement *)0x0) {
        iVar2 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x29])
                          (pDVar4,SchemaSymbols::fgATT_TARGETNAMESPACE);
        str1 = (XMLCh *)CONCAT44(extraout_var_01,iVar2);
        if (*str1 == L'\0') {
LAB_0031056a:
          iVar2 = (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x2a])(pDVar4,XMLUni::fgXMLNSString);
          if ((CONCAT44(extraout_var_02,iVar2) == 0) &&
             (this->fTargetNSURI != this->fEmptyNamespaceURI)) {
            (*(pDVar4->super_DOMNode)._vptr_DOMNode[0x2c])
                      (pDVar4,XMLUni::fgXMLNSString,this->fTargetNSURIString);
          }
        }
        else {
          bVar1 = XMLString::equals(str1,this->fTargetNSURIString);
          if (!bVar1) {
            reportSchemaError(this,pDVar4,(XMLCh *)XMLUni::fgXMLErrDomain,0x4c,loc,str1,(XMLCh *)0x0
                              ,(XMLCh *)0x0);
            goto LAB_003103bd;
          }
          if (*str1 == L'\0') goto LAB_0031056a;
        }
        pSVar5 = this->fSchemaInfo;
        pSVar8 = (SchemaInfo *)XMemory::operator_new(0xe8,this->fMemoryManager);
        SchemaInfo::SchemaInfo
                  (pSVar8,0,0,0,this->fTargetNSURI,(NamespaceScope *)0x0,schemaURL,
                   this->fTargetNSURIString,pDVar4,this->fScanner,this->fGrammarPoolMemoryManager);
        this->fSchemaInfo = pSVar8;
        NamespaceScope::reset(pSVar8->fNamespaceScope,this->fEmptyNamespaceURI);
        this_00 = this->fSchemaInfo->fNamespaceScope;
        uVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fURIStringPool,XMLUni::fgXMLURIName);
        NamespaceScope::addPrefix(this_00,L"xml",uVar3);
        pSVar8 = this->fSchemaInfo;
        RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::put
                  (this->fSchemaInfoList,pSVar8->fCurrentSchemaURL,pSVar8->fTargetNSURI,pSVar8);
        RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::put
                  (this->fPreprocessedNodes,elem,this->fSchemaInfo);
        SchemaInfo::addSchemaInfo(pSVar5,this->fSchemaInfo,INCLUDE);
        traverseSchemaHeader(this,pDVar4);
        preprocessChildren(this,pDVar4);
        this->fSchemaInfo = pSVar5;
      }
    }
  }
  else {
LAB_003103ab:
    SchemaInfo::addSchemaInfo(this->fSchemaInfo,pSVar5,INCLUDE);
  }
LAB_003103bd:
  (*source->_vptr_InputSource[1])(source);
LAB_003103ee:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return;
}

Assistant:

void TraverseSchema::preprocessInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Include, this, true, fNonXSAttList);

    // -----------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // -----------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    if (fAnnotation)
        fSchemaGrammar->addAnnotation(fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->addAnnotation(fAnnotation);
    }

    // -----------------------------------------------------------------------
    // Get 'schemaLocation' attribute
    // -----------------------------------------------------------------------
    const XMLCh* schemaLocation = getElementAttValue(elem, SchemaSymbols::fgATT_SCHEMALOCATION, DatatypeValidator::AnyURI);

    if (!schemaLocation || !*schemaLocation) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNoSchemaLocation, SchemaSymbols::fgELT_INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Resolve schema location
    // ------------------------------------------------------------------
    fLocator->setValues(fSchemaInfo->getCurrentSchemaURL(), 0,
                        ((XSDElementNSImpl*) elem)->getLineNo(),
                        ((XSDElementNSImpl*) elem)->getColumnNo());
    InputSource* srcToFill = resolveSchemaLocation(schemaLocation,
            XMLResourceIdentifier::SchemaInclude);
    Janitor<InputSource> janSrc(srcToFill);

    // Nothing to do
    if (!srcToFill) {
        return;
    }

    const XMLCh* includeURL = srcToFill->getSystemId();
    SchemaInfo* includeSchemaInfo = fCachedSchemaInfoList->get(includeURL, fTargetNSURI);

    if (!includeSchemaInfo && fSchemaInfoList != fCachedSchemaInfoList)
      includeSchemaInfo = fSchemaInfoList->get(includeURL, fTargetNSURI);

    if (includeSchemaInfo) {

        fSchemaInfo->addSchemaInfo(includeSchemaInfo, SchemaInfo::INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Parse input source
    // ------------------------------------------------------------------
    if (!fParser)
        fParser = new (fGrammarPoolMemoryManager) XSDDOMParser(0, fGrammarPoolMemoryManager, 0);

    fParser->setValidationScheme(XercesDOMParser::Val_Never);
    fParser->setDoNamespaces(true);
    fParser->setUserEntityHandler(fEntityHandler);
    fParser->setUserErrorReporter(fErrorReporter);

    // Should just issue warning if the schema is not found
    bool flag = srcToFill->getIssueFatalErrorIfNotFound();
    srcToFill->setIssueFatalErrorIfNotFound(false);

    fParser->parse(*srcToFill);

    // Reset the InputSource
    srcToFill->setIssueFatalErrorIfNotFound(flag);

    if (fParser->getSawFatal() && fScanner->getExitOnFirstFatal())
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::SchemaScanFatalError);

    // ------------------------------------------------------------------
    // Get root element
    // ------------------------------------------------------------------
    DOMDocument* document = fParser->getDocument();

    if (document) {

        DOMElement* root = document->getDocumentElement();

        if (root) {

            const XMLCh* targetNSURIString = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);

            // check to see if targetNameSpace is right
            if (*targetNSURIString
                && !XMLString::equals(targetNSURIString,fTargetNSURIString)){
                reportSchemaError(root, XMLUni::fgXMLErrDomain, XMLErrs::IncludeNamespaceDifference,
                                  schemaLocation, targetNSURIString);
                return;
            }

            // if targetNamespace is empty, change it to includ'g schema
            // targetNamespace
            if (!*targetNSURIString && root->getAttributeNode(XMLUni::fgXMLNSString) == 0
                && fTargetNSURI != fEmptyNamespaceURI) {
                root->setAttribute(XMLUni::fgXMLNSString, fTargetNSURIString);
            }

            // --------------------------------------------------------
            // Update schema information with included schema
            // --------------------------------------------------------
            SchemaInfo* saveInfo = fSchemaInfo;

            fSchemaInfo = new (fMemoryManager) SchemaInfo(0, 0, 0, fTargetNSURI,
                                         0,
                                         includeURL,
                                         fTargetNSURIString, root,
                                         fScanner,
                                         fGrammarPoolMemoryManager);

            fSchemaInfo->getNamespaceScope()->reset(fEmptyNamespaceURI);
            // Add mapping for the xml prefix
            fSchemaInfo->getNamespaceScope()->addPrefix(XMLUni::fgXMLString, fURIStringPool->addOrFind(XMLUni::fgXMLURIName));

            fSchemaInfoList->put((void*) fSchemaInfo->getCurrentSchemaURL(),
                                 fSchemaInfo->getTargetNSURI(), fSchemaInfo);
            fPreprocessedNodes->put((void*) elem, fSchemaInfo);
            saveInfo->addSchemaInfo(fSchemaInfo, SchemaInfo::INCLUDE);
            traverseSchemaHeader(root);
            preprocessChildren(root);
            fSchemaInfo = saveInfo;
        }
    }
}